

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  byte *pbVar1;
  u8 uVar2;
  sqlite3 *psVar3;
  Expr *pEVar4;
  Select *pSVar5;
  anon_union_8_3_1bb8468b_for_uNC aVar6;
  Select *pSVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Expr *pEVar11;
  ExprList_item *pEVar12;
  long lVar13;
  Expr *pE;
  Expr *pEVar14;
  ulong uVar15;
  int iVar16;
  ExprList *pEVar17;
  ulong uVar18;
  ExprList_item *pEVar19;
  Expr *p;
  int iCol;
  int local_b4;
  Expr *local_b0;
  sqlite3 *local_a8;
  int local_9c;
  Select *local_98;
  ExprList *local_90;
  Parse *local_88;
  anon_union_8_3_1bb8468b_for_uNC local_80;
  Parse *local_78;
  ExprList_item *local_70;
  NameContext local_68;
  
  pEVar17 = pSelect->pOrderBy;
  if (pEVar17 == (ExprList *)0x0) {
    return 0;
  }
  local_a8 = pParse->db;
  uVar10 = pEVar17->nExpr;
  uVar18 = (ulong)uVar10;
  if (local_a8->aLimit[2] < (int)uVar10) {
    sqlite3ErrorMsg(pParse,"too many terms in ORDER BY clause");
  }
  else {
    if (0 < (int)uVar10) {
      lVar13 = 0;
      do {
        pbVar1 = &pEVar17->a[0].field_0x19 + lVar13;
        *pbVar1 = *pbVar1 & 0xfe;
        lVar13 = lVar13 + 0x20;
      } while (uVar18 << 5 != lVar13);
    }
    pSelect->pNext = (Select *)0x0;
    pSVar7 = pSelect->pPrior;
    while (pSVar5 = pSVar7, pSVar5 != (Select *)0x0) {
      pSVar5->pNext = pSelect;
      pSelect = pSVar5;
      pSVar7 = pSVar5->pPrior;
    }
    local_70 = pEVar17->a;
    local_90 = pEVar17;
    local_78 = pParse;
    do {
      if ((int)uVar18 < 1) {
        return 0;
      }
      local_88 = (Parse *)pSelect->pEList;
      local_9c = 0;
      iVar16 = 0;
      pEVar19 = local_70;
      do {
        local_b4 = -1;
        if ((pEVar19->field_0x19 & 1) == 0) {
          p = pEVar19->pExpr;
          while (p != (Expr *)0x0) {
            if ((p->flags >> 0xc & 1) == 0) goto LAB_00173667;
            if ((p->flags >> 0x12 & 1) == 0) {
              pEVar12 = (ExprList_item *)&p->pLeft;
            }
            else {
              pEVar12 = ((p->x).pList)->a;
            }
            p = pEVar12->pExpr;
          }
          p = (Expr *)0x0;
LAB_00173667:
          iVar8 = sqlite3ExprIsInteger(p,&local_b4);
          if (iVar8 == 0) {
            local_b4 = resolveAsName(local_88,(ExprList *)p,pE);
            if (local_b4 == 0) {
              pEVar11 = p;
              if (pParse->eParseMode < 2) {
                if (p == (Expr *)0x0) {
                  pEVar11 = (Expr *)0x0;
                }
                else {
                  pEVar11 = exprDup(local_a8,p,0,(u8 **)0x0);
                }
              }
              iVar8 = local_b4;
              if (local_a8->mallocFailed == '\0') {
                local_80.pEList = pSelect->pEList;
                local_68.pSrcList = pSelect->pSrc;
                local_68.pWinSelect = (Select *)0x0;
                local_68.pNext = (NameContext *)0x0;
                local_68.nRef = 0;
                local_68.nErr = 0;
                local_68.ncFlags = 0x81;
                local_68._42_6_ = 0;
                psVar3 = pParse->db;
                uVar2 = psVar3->suppressErr;
                psVar3->suppressErr = '\x01';
                local_b0 = pEVar11;
                local_68.pParse = pParse;
                local_68.uNC.pEList = local_80.pEList;
                iVar9 = sqlite3ResolveExprNames(&local_68,pEVar11);
                aVar6 = local_80;
                psVar3->suppressErr = uVar2;
                pEVar11 = local_b0;
                pParse = local_78;
                iVar8 = 0;
                if ((iVar9 == 0) && (local_98 = pSelect, 0 < (local_80.pEList)->nExpr)) {
                  pEVar12 = (local_80.pEList)->a;
                  lVar13 = 0;
                  do {
                    uVar10 = sqlite3ExprCompare((Parse *)0x0,pEVar12->pExpr,local_b0,-1);
                    pEVar11 = local_b0;
                    pSelect = local_98;
                    pParse = local_78;
                    if (uVar10 < 2) {
                      iVar8 = (int)lVar13 + 1;
                      goto LAB_001737b6;
                    }
                    lVar13 = lVar13 + 1;
                    pEVar12 = pEVar12 + 1;
                  } while (lVar13 < (aVar6.pEList)->nExpr);
                  iVar8 = 0;
                }
              }
LAB_001737b6:
              local_b4 = iVar8;
              if ((pParse->eParseMode < 2) && (pEVar11 != (Expr *)0x0)) {
                sqlite3ExprDeleteNN(local_a8,pEVar11);
              }
            }
            if (local_b4 < 1) {
              local_9c = 1;
              pEVar17 = local_90;
              goto LAB_00173867;
            }
          }
          else if ((local_b4 < 1) || (*(int *)&local_88->db < local_b4)) {
            sqlite3ErrorMsg(pParse,"%r %s BY term out of range - should be between 1 and %d",
                            (ulong)(iVar16 + 1),"ORDER");
            return 1;
          }
          iVar8 = local_b4;
          if (pParse->eParseMode < 2) {
            local_68.pParse = (Parse *)0x0;
            local_68.pSrcList = (SrcList *)((ulong)local_68.pSrcList & 0xffffffff00000000);
            pEVar11 = sqlite3ExprAlloc(local_a8,0x93,(Token *)&local_68,0);
            if (pEVar11 == (Expr *)0x0) {
              return 1;
            }
            pbVar1 = (byte *)((long)&pEVar11->flags + 1);
            *pbVar1 = *pbVar1 | 4;
            (pEVar11->u).iValue = iVar8;
            pEVar12 = pEVar19;
            pEVar4 = pEVar19->pExpr;
            if (pEVar19->pExpr != p) {
              do {
                pEVar14 = pEVar4;
                pEVar4 = pEVar14->pLeft;
              } while (pEVar4->op == 'j');
              pEVar12 = (ExprList_item *)&pEVar14->pLeft;
            }
            pEVar12->pExpr = pEVar11;
            if (p != (Expr *)0x0) {
              sqlite3ExprDeleteNN(local_a8,p);
              iVar8 = local_b4;
            }
            (pEVar19->u).x.iOrderByCol = (u16)iVar8;
          }
          pEVar19->field_0x19 = pEVar19->field_0x19 | 1;
          pEVar17 = local_90;
        }
LAB_00173867:
        iVar16 = iVar16 + 1;
        pEVar19 = pEVar19 + 1;
        uVar10 = pEVar17->nExpr;
        uVar18 = (ulong)uVar10;
      } while (iVar16 < (int)uVar10);
      pSelect = pSelect->pNext;
    } while ((pSelect != (Select *)0x0) && (local_9c != 0));
    if ((int)uVar10 < 1) {
      return 0;
    }
    uVar15 = 1;
    lVar13 = 0;
    while (((&pEVar17->a[0].field_0x19)[lVar13] & 1) != 0) {
      uVar15 = (ulong)((int)uVar15 + 1);
      lVar13 = lVar13 + 0x20;
      if (uVar18 << 5 == lVar13) {
        return 0;
      }
    }
    sqlite3ErrorMsg(pParse,"%r ORDER BY term does not match any column in the result set",uVar15);
  }
  return 1;
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->done ) continue;
      pE = sqlite3ExprSkipCollate(pItem->pExpr);
      if( sqlite3ExprIsInteger(pE, &iCol) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          /* Now test if expression pE matches one of the values returned
          ** by pSelect. In the usual case this is done by duplicating the 
          ** expression, resolving any symbols in it, and then comparing
          ** it against each expression returned by the SELECT statement.
          ** Once the comparisons are finished, the duplicate expression
          ** is deleted.
          **
          ** Or, if this is running as part of an ALTER TABLE operation,
          ** resolve the symbols in the actual expression, not a duplicate.
          ** And, if one of the comparisons is successful, leave the expression
          ** as is instead of transforming it to an integer as in the usual
          ** case. This allows the code in alter.c to modify column
          ** refererences within the ORDER BY expression as required.  */
          if( IN_RENAME_OBJECT ){
            pDup = pE;
          }else{
            pDup = sqlite3ExprDup(db, pE, 0);
          }
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
          }
          if( !IN_RENAME_OBJECT ){
            sqlite3ExprDelete(db, pDup);
          }
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists */
        if( !IN_RENAME_OBJECT ){
          Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
          if( pNew==0 ) return 1;
          pNew->flags |= EP_IntValue;
          pNew->u.iValue = iCol;
          if( pItem->pExpr==pE ){
            pItem->pExpr = pNew;
          }else{
            Expr *pParent = pItem->pExpr;
            assert( pParent->op==TK_COLLATE );
            while( pParent->pLeft->op==TK_COLLATE ) pParent = pParent->pLeft;
            assert( pParent->pLeft==pE );
            pParent->pLeft = pNew;
          }
          sqlite3ExprDelete(db, pE);
          pItem->u.x.iOrderByCol = (u16)iCol;
        }
        pItem->done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}